

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O1

void __thiscall OSSLDSAPublicKey::setFromOSSL(OSSLDSAPublicKey *this,DSA *inDSA)

{
  ByteString inP;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_g;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  ByteString local_68;
  BIGNUM *local_40;
  BIGNUM *local_38;
  BIGNUM *local_30;
  BIGNUM *local_28;
  
  local_28 = (BIGNUM *)0x0;
  local_30 = (BIGNUM *)0x0;
  local_38 = (BIGNUM *)0x0;
  local_40 = (BIGNUM *)0x0;
  DSA_get0_pqg(inDSA,&local_28);
  DSA_get0_key(inDSA,&local_40,0);
  if (local_28 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_68,local_28);
    (**(code **)(*(long *)&this->super_DSAPublicKey + 0x30))(this,&local_68);
    local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_68.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_30 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_68,local_30);
    (**(code **)(*(long *)&this->super_DSAPublicKey + 0x38))(this,&local_68);
    local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_68.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_38 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_68,local_38);
    (**(code **)(*(long *)&this->super_DSAPublicKey + 0x40))(this,&local_68);
    local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_68.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  if (local_40 != (BIGNUM *)0x0) {
    OSSL::bn2ByteString(&local_68,local_40);
    (**(code **)(*(long *)&this->super_DSAPublicKey + 0x48))(this,&local_68);
    local_68._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_68.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return;
}

Assistant:

void OSSLDSAPublicKey::setFromOSSL(const DSA* inDSA)
{
	const BIGNUM* bn_p = NULL;
	const BIGNUM* bn_q = NULL;
	const BIGNUM* bn_g = NULL;
	const BIGNUM* bn_pub_key = NULL;

	DSA_get0_pqg(inDSA, &bn_p, &bn_q, &bn_g);
	DSA_get0_key(inDSA, &bn_pub_key, NULL);

	if (bn_p)
	{
		ByteString inP = OSSL::bn2ByteString(bn_p);
		setP(inP);
	}
	if (bn_q)
	{
		ByteString inQ = OSSL::bn2ByteString(bn_q);
		setQ(inQ);
	}
	if (bn_g)
	{
		ByteString inG = OSSL::bn2ByteString(bn_g);
		setG(inG);
	}
	if (bn_pub_key)
	{
		ByteString inY = OSSL::bn2ByteString(bn_pub_key);
		setY(inY);
	}
}